

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O0

void skiwi::format_test_8(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  anon_unknown_0 local_38 [8];
  string res;
  format_options ops;
  
  skiwi::format_options::format_options((format_options *)(res.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ",
             &local_79);
  skiwi::format(local_58,(format_options *)local_78);
  anon_unknown_0::cleanup(local_38,(EVP_PKEY_CTX *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,
             "\n(let ([f (lambda\n           (a0 a1 . args)\n           (vector a0 a1))])\n     (f 10 20 30 40 50 60 70 80 90 100))\n"
             ,&local_d1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_b0,(EVP_PKEY_CTX *)local_d0);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_b0,&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x114,"void skiwi::format_test_8()");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void format_test_8()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ", ops));
  TEST_EQ(cleanup(R"(
(let ([f (lambda
           (a0 a1 . args)
           (vector a0 a1))])
     (f 10 20 30 40 50 60 70 80 90 100))
)"), res);
  }